

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O2

REF_STATUS ref_dict_remove(REF_DICT ref_dict,REF_INT key)

{
  REF_STATUS RVar1;
  int iVar2;
  long lVar3;
  REF_INT location;
  int local_c;
  
  RVar1 = ref_dict_location(ref_dict,key,&local_c);
  if (RVar1 == 0) {
    iVar2 = ref_dict->n + -1;
    ref_dict->n = iVar2;
    for (lVar3 = (long)local_c; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      ref_dict->key[lVar3] = ref_dict->key[lVar3 + 1];
      iVar2 = ref_dict->n;
    }
    for (lVar3 = (long)local_c; lVar3 < iVar2; lVar3 = lVar3 + 1) {
      ref_dict->value[lVar3] = ref_dict->value[lVar3 + 1];
      iVar2 = ref_dict->n;
    }
    RVar1 = 0;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_dict_remove(REF_DICT ref_dict, REF_INT key) {
  REF_INT i, location;

  RAISE(ref_dict_location(ref_dict, key, &location));

  ref_dict_n(ref_dict)--;

  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->key[i] = ref_dict->key[i + 1];
  }
  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->value[i] = ref_dict->value[i + 1];
  }

  return REF_SUCCESS;
}